

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpparser.c
# Opt level: O0

parse_status_t parser_parse_entity(http_parser_t *parser)

{
  parse_status_t local_14;
  parse_status_t status;
  http_parser_t *parser_local;
  
  if (parser->position == POS_ENTITY) {
    do {
      switch(parser->ent_position) {
      case 1:
        local_14 = parser_get_entity_read_method(parser);
        break;
      case 2:
        local_14 = parser_parse_entity_using_clen(parser);
        break;
      case 3:
        local_14 = parser_parse_chunky_entity(parser);
        break;
      case 4:
        local_14 = parser_parse_entity_until_close(parser);
        break;
      case 5:
        local_14 = parser_parse_chunky_body(parser);
        break;
      case 6:
        local_14 = parser_parse_chunky_headers(parser);
        break;
      default:
        __assert_fail("0",".upnp/src/genlib/net/http/httpparser.c",0x7bf,
                      "parse_status_t parser_parse_entity(http_parser_t *)");
      }
    } while (local_14 == PARSE_CONTINUE_1);
    return local_14;
  }
  __assert_fail("parser->position == POS_ENTITY",".upnp/src/genlib/net/http/httpparser.c",0x7a1,
                "parse_status_t parser_parse_entity(http_parser_t *)");
}

Assistant:

parse_status_t parser_parse_entity(http_parser_t *parser)
{
	parse_status_t status;

	assert(parser->position == POS_ENTITY);

	do {
		switch (parser->ent_position) {
		case ENTREAD_USING_CLEN:
			status = parser_parse_entity_using_clen(parser);
			break;

		case ENTREAD_USING_CHUNKED:
			status = parser_parse_chunky_entity(parser);
			break;

		case ENTREAD_CHUNKY_BODY:
			status = parser_parse_chunky_body(parser);
			break;

		case ENTREAD_CHUNKY_HEADERS:
			status = parser_parse_chunky_headers(parser);
			break;

		case ENTREAD_UNTIL_CLOSE:
			status = parser_parse_entity_until_close(parser);
			break;

		case ENTREAD_DETERMINE_READ_METHOD:
			status = parser_get_entity_read_method(parser);
			break;

		default:
			status = PARSE_FAILURE;
			assert(0);
		}

	} while (status == (parse_status_t)PARSE_CONTINUE_1);

	return status;
}